

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O1

void csguide_webserver::Epoll::HandleConnection(ServerSocket *server_socket)

{
  int fd;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ClientSocket *pCVar3;
  char cVar4;
  int iVar5;
  HttpData *__p;
  HttpRequest *__p_00;
  HttpResponse *this;
  ClientSocket *__p_01;
  __uint32_t events;
  shared_ptr<csguide_webserver::HttpData> sharedHttpData;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  ClientSocket *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  shared_ptr<csguide_webserver::HttpData> local_78;
  shared_ptr<csguide_webserver::HttpData> local_68;
  size_t local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_88 = (ClientSocket *)operator_new(0x18);
  local_88->fd_ = -1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<csguide_webserver::ClientSocket*>
            (&_Stack_80,local_88);
  local_58 = 20000;
  while( true ) {
    iVar5 = ServerSocket::Accept(server_socket,local_88);
    if (iVar5 < 1) break;
    iVar5 = SetNonBlocking(local_88->fd_);
    if (iVar5 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"setnonblocking error",0x14);
      cVar4 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      iVar5 = (int)cVar4;
      std::ostream::put(-0x48);
      std::ostream::flush();
      ClientSocket::close(local_88,iVar5);
    }
    else {
      __p = (HttpData *)operator_new(0x58);
      (__p->client_socket_).
      super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__p->client_socket_).
      super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__p->response_).
      super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__p->response_).
      super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__p->request_).super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (__p->request_).super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__p->super_enable_shared_from_this<csguide_webserver::HttpData>)._M_weak_this.
      super___weak_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__p->super_enable_shared_from_this<csguide_webserver::HttpData>)._M_weak_this.
      super___weak_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __p->epoll_fd = -1;
      (__p->timer_).super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (__p->timer_).super___weak_ptr<csguide_webserver::TimerNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<csguide_webserver::HttpData,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<csguide_webserver::HttpData,void>
                ((__shared_ptr<csguide_webserver::HttpData,(__gnu_cxx::_Lock_policy)2> *)&local_98,
                 __p);
      __p_00 = (HttpRequest *)operator_new(0x68);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      __p_00->mMethod = METHOD_NOT_SUPPORT;
      __p_00->mVersion = VERSION_NOT_SUPPORT;
      (__p_00->mUri)._M_dataplus._M_p = (pointer)&(__p_00->mUri).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__p_00->mUri,local_50,local_50 + local_48);
      __p_00->mContent = (char *)0x0;
      (__p_00->mHeaders)._M_h._M_buckets = (__buckets_ptr)0x0;
      (__p_00->mHeaders)._M_h._M_bucket_count = 0;
      (__p_00->mHeaders)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__p_00->mHeaders)._M_h._M_element_count = 0;
      *(undefined8 *)&(__p_00->mHeaders)._M_h._M_rehash_policy = 0;
      (__p_00->mHeaders)._M_h._M_buckets = &(__p_00->mHeaders)._M_h._M_single_bucket;
      (__p_00->mHeaders)._M_h._M_bucket_count = 1;
      (__p_00->mHeaders)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__p_00->mHeaders)._M_h._M_element_count = 0;
      (__p_00->mHeaders)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__p_00->mHeaders)._M_h._M_rehash_policy._M_next_resize = 0;
      (__p_00->mHeaders)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<csguide_webserver::HttpRequest*>(&_Stack_a0,__p_00);
      _Var2._M_pi = _Stack_a0._M_pi;
      _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (local_98->request_).
               super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (local_98->request_).
      super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p_00
      ;
      (local_98->request_).
      super___shared_ptr<csguide_webserver::HttpRequest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this = (HttpResponse *)operator_new(0xb8);
      HttpResponse::HttpResponse(this,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<csguide_webserver::HttpResponse*>(&_Stack_a0,this);
      _Var2._M_pi = _Stack_a0._M_pi;
      _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (local_98->response_).
               super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (local_98->response_).
      super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
      (local_98->response_).
      super___shared_ptr<csguide_webserver::HttpResponse,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var2._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
      }
      __p_01 = (ClientSocket *)operator_new(0x18);
      __p_01->fd_ = -1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<csguide_webserver::ClientSocket*>(&_Stack_a0,__p_01);
      _Var2._M_pi = _Stack_80._M_pi;
      pCVar3 = local_88;
      _Stack_80._M_pi = _Stack_a0._M_pi;
      _Stack_a0._M_pi = _Var2._M_pi;
      (local_98->client_socket_).
      super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_88;
      local_88 = __p_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(local_98->client_socket_).
                  super___shared_ptr<csguide_webserver::ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&_Stack_a0);
      iVar5 = server_socket->epoll_fd_;
      local_98->epoll_fd = iVar5;
      fd = pCVar3->fd_;
      local_68.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_98;
      local_68.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_90;
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_90->_M_use_count = local_90->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_90->_M_use_count = local_90->_M_use_count + 1;
        }
      }
      Addfd(iVar5,fd,events,&local_68);
      if (local_68.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.
                   super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_78.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_98;
      local_78.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_90;
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_90->_M_use_count = local_90->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_90->_M_use_count = local_90->_M_use_count + 1;
        }
      }
      TimerManager::addTimer((TimerManager *)timer_manager_,&local_78,local_58);
      if (local_78.super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.
                   super___shared_ptr<csguide_webserver::HttpData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
    }
  }
  if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
  }
  return;
}

Assistant:

void Epoll::HandleConnection(const ServerSocket &server_socket) {
  std::shared_ptr<ClientSocket> tempClient(new ClientSocket);
  // epoll 是ET模式，循环接收连接
  // 需要将listen_fd设置为non-blocking

  while (server_socket.Accept(*tempClient) > 0) {
    // 设置非阻塞
    int ret = SetNonBlocking(tempClient->fd_);
    if (ret < 0) {
      std::cout << "setnonblocking error" << std::endl;
      tempClient->close();
      continue;
    }

    // FIXME 接受新客户端 构造HttpData并添加定时器

    // 在这里做限制并发, 暂时未完成

    std::shared_ptr<HttpData> sharedHttpData(new HttpData);
    sharedHttpData->request_ = std::shared_ptr<HttpRequest>(new HttpRequest());
    sharedHttpData->response_ = std::shared_ptr<HttpResponse>(new HttpResponse());

    std::shared_ptr<ClientSocket> sharedClientSocket(new ClientSocket());
    sharedClientSocket.swap(tempClient);
    sharedHttpData->client_socket_ = sharedClientSocket;
    sharedHttpData->epoll_fd = server_socket.epoll_fd_;
    Addfd(server_socket.epoll_fd_, sharedClientSocket->fd_, DEFAULT_EVENTS, sharedHttpData);
    // FIXME 默认超时时间5 秒测试添加定时器
    timer_manager_.addTimer(sharedHttpData, TimerManager::DEFAULT_TIME_OUT);
  }
}